

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonAppendString(JsonString *p,char *zIn,u32 N)

{
  u8 c;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  u8 *z;
  u64 uVar5;
  
  if (zIn == (char *)0x0) {
    return;
  }
  uVar5 = p->nUsed;
  if (p->nAlloc <= N + uVar5 + 2) {
    iVar2 = jsonStringGrow(p,N + 2);
    if (iVar2 != 0) {
      return;
    }
    uVar5 = p->nUsed;
  }
  p->nUsed = uVar5 + 1;
  p->zBuf[uVar5] = '\"';
  do {
    uVar4 = 0;
    if (3 < N) {
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        iVar2 = (int)uVar4;
        if ((((""[((u8 *)zIn)[uVar4]] == '\0') ||
             (uVar4 = (ulong)(iVar2 + 1), ""[((u8 *)zIn)[uVar4]] == '\0')) ||
            (uVar4 = (ulong)(iVar2 + 2), ""[((u8 *)zIn)[uVar4]] == '\0')) ||
           (uVar4 = (ulong)(iVar2 + 3U), ""[((u8 *)zIn)[iVar2 + 3U]] == '\0')) goto LAB_001bc2d8;
        uVar4 = (ulong)(iVar2 + 4U);
        uVar1 = (ulong)(iVar2 + 4U);
      } while (iVar2 + 7U < N);
    }
    if ((uint)uVar4 < N) {
      while (""[((u8 *)zIn)[uVar4]] != '\0') {
        uVar4 = uVar4 + 1;
        uVar3 = N;
        if (N == uVar4) goto LAB_001bc3c6;
      }
    }
LAB_001bc2d8:
    uVar3 = (uint)uVar4;
    if (N < uVar3 || N - uVar3 == 0) {
LAB_001bc3c6:
      uVar5 = p->nUsed;
      if (uVar3 != 0) {
        memcpy(p->zBuf + uVar5,zIn,(ulong)uVar3);
        uVar5 = (ulong)uVar3 + p->nUsed;
      }
      p->nUsed = uVar5 + 1;
      p->zBuf[uVar5] = '\"';
      return;
    }
    if (uVar3 != 0) {
      uVar4 = uVar4 & 0xffffffff;
      memcpy(p->zBuf + p->nUsed,zIn,uVar4);
      p->nUsed = p->nUsed + uVar4;
      zIn = (char *)((u8 *)zIn + uVar4);
      N = N - uVar3;
    }
    c = *zIn;
    if (c == '\\') {
LAB_001bc31d:
      uVar5 = p->nUsed;
      if (p->nAlloc < N + uVar5 + 3) {
        iVar2 = jsonStringGrow(p,N + 3);
        if (iVar2 != 0) {
          return;
        }
        uVar5 = p->nUsed;
      }
      p->nUsed = uVar5 + 1;
      p->zBuf[uVar5] = '\\';
      uVar5 = p->nUsed;
      p->nUsed = uVar5 + 1;
      p->zBuf[uVar5] = c;
    }
    else if (c == '\'') {
      uVar5 = p->nUsed;
      p->nUsed = uVar5 + 1;
      p->zBuf[uVar5] = '\'';
    }
    else {
      if (c == '\"') goto LAB_001bc31d;
      if ((p->nAlloc < p->nUsed + (ulong)N + 7) && (iVar2 = jsonStringGrow(p,N + 7), iVar2 != 0)) {
        return;
      }
      jsonAppendControlChar(p,c);
    }
    zIn = (char *)((u8 *)zIn + 1);
    N = N - 1;
  } while( true );
}

Assistant:

static void jsonAppendString(JsonString *p, const char *zIn, u32 N){
  u32 k;
  u8 c;
  const u8 *z = (const u8*)zIn;
  if( z==0 ) return;
  if( (N+p->nUsed+2 >= p->nAlloc) && jsonStringGrow(p,N+2)!=0 ) return;
  p->zBuf[p->nUsed++] = '"';
  while( 1 /*exit-by-break*/ ){
    k = 0;
    /* The following while() is the 4-way unwound equivalent of
    **
    **     while( k<N && jsonIsOk[z[k]] ){ k++; }
    */
    while( 1 /* Exit by break */ ){
      if( k+3>=N ){
        while( k<N && jsonIsOk[z[k]] ){ k++; }
        break;
      }
      if( !jsonIsOk[z[k]] ){
        break;
      }
      if( !jsonIsOk[z[k+1]] ){
        k += 1;
        break;
      }
      if( !jsonIsOk[z[k+2]] ){
        k += 2;
        break;
      }
      if( !jsonIsOk[z[k+3]] ){
        k += 3;
        break;
      }else{
        k += 4;
      }
    }
    if( k>=N ){
      if( k>0 ){
        memcpy(&p->zBuf[p->nUsed], z, k);
        p->nUsed += k;
      }
      break;
    }
    if( k>0 ){
      memcpy(&p->zBuf[p->nUsed], z, k);
      p->nUsed += k;
      z += k;
      N -= k;
    }
    c = z[0];
    if( c=='"' || c=='\\' ){
      if( (p->nUsed+N+3 > p->nAlloc) && jsonStringGrow(p,N+3)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
      p->zBuf[p->nUsed++] = c;
    }else if( c=='\'' ){
      p->zBuf[p->nUsed++] = c;
    }else{
      if( (p->nUsed+N+7 > p->nAlloc) && jsonStringGrow(p,N+7)!=0 ) return;
      jsonAppendControlChar(p, c);
    }
    z++;
    N--;
  }
  p->zBuf[p->nUsed++] = '"';
  assert( p->nUsed<p->nAlloc );
}